

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O0

long mk_date(long index,date_t *d)

{
  int iVar1;
  char *dest;
  char *pcVar2;
  tm *ptVar3;
  size_t sVar4;
  long *in_RSI;
  long in_RDI;
  tm *localTime;
  time_t numDateTime;
  long espan;
  
  dest = (char *)((in_RDI + -1) * 0x15180);
  pcVar2 = dest + 0x2961591d;
  ptVar3 = localtime((time_t *)&stack0xffffffffffffffe0);
  *(int *)(in_RSI + 8) = (int)(((long)ptVar3->tm_wday + 1) % 7) + 1;
  *(int *)((long)in_RSI + 0x4c) = ptVar3->tm_mon + 1;
  strncpy((char *)((long)in_RSI + 0x1b),weekday_names[(int)in_RSI[8] + -1],10);
  strncpy((char *)((long)in_RSI + 0x25),month_names[*(int *)((long)in_RSI + 0x4c) + -1],10);
  *(int *)(in_RSI + 6) = ptVar3->tm_year + 0x76c;
  *(int *)((long)in_RSI + 0x44) = ptVar3->tm_mday;
  *(int *)((long)in_RSI + 0x34) = (int)in_RSI[6] * 100 + *(int *)((long)in_RSI + 0x4c);
  sprintf((char *)(in_RSI + 7),"%.3s%d",(long)in_RSI + 0x25,(ulong)*(uint *)(in_RSI + 6));
  sprintf((char *)(in_RSI + 1),"%s %d, %d",(long)in_RSI + 0x25,(ulong)*(uint *)((long)in_RSI + 0x44)
          ,(ulong)*(uint *)(in_RSI + 6));
  *in_RSI = (long)((int)in_RSI[6] * 10000 + *(int *)((long)in_RSI + 0x4c) * 100 +
                  *(int *)((long)in_RSI + 0x44));
  *(int *)(in_RSI + 9) = ptVar3->tm_yday + 1;
  *(int *)(in_RSI + 10) = (int)in_RSI[9] / 7 + 1;
  if ((int)in_RSI[8] == 7) {
    *(undefined1 *)(in_RSI + 0xd) = 0x31;
  }
  else {
    *(undefined1 *)(in_RSI + 0xd) = 0x30;
  }
  *(undefined1 *)((long)in_RSI + 0x69) = 0;
  iVar1 = is_last_day_in_month
                    ((int)in_RSI[6],*(int *)((long)in_RSI + 0x4c),*(int *)((long)in_RSI + 0x44));
  if (iVar1 == 1) {
    *(undefined1 *)((long)in_RSI + 0x6a) = 0x31;
  }
  else {
    *(undefined1 *)((long)in_RSI + 0x6a) = 0x30;
  }
  *(undefined1 *)((long)in_RSI + 0x6b) = 0;
  if (((int)in_RSI[8] == 1) || ((int)in_RSI[8] == 7)) {
    *(undefined1 *)((long)in_RSI + 0x6e) = 0x30;
  }
  else {
    *(undefined1 *)((long)in_RSI + 0x6e) = 0x31;
  }
  *(undefined1 *)((long)in_RSI + 0x6f) = 0;
  gen_season(dest,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2);
  sVar4 = strlen((char *)((long)in_RSI + 0x54));
  *(int *)((long)in_RSI + 100) = (int)sVar4;
  gen_holiday_fl(dest,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2);
  return 0;
}

Assistant:

long
mk_date(long index,date_t *d)
{
    long espan = (index-1)*60*60*24;
    
    time_t numDateTime = D_STARTDATE + espan; 

    struct tm *localTime = localtime(&numDateTime); 
 
    /*make Sunday be the first day of a week */
    d->daynuminweek=((long)localTime->tm_wday+1)%7+1;
    d->monthnuminyear=(long)localTime->tm_mon+1;
#if __GNUC__ >= 8
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wstringop-truncation"
#endif
    strncpy(d->dayofweek, weekday_names[d->daynuminweek-1],D_DAYWEEK_LEN+1);
    strncpy(d->month,month_names[d->monthnuminyear-1],D_MONTH_LEN+1);
#if __GNUC__ >= 8
#pragma GCC diagnostic pop
#endif
    d->year=(long)localTime->tm_year + 1900;
    d->daynuminmonth=(long)localTime->tm_mday;
    d->yearmonthnum=d->year * 100 + d->monthnuminyear;

    sprintf(d->yearmonth,"%.3s%d",d->month,d->year);
    sprintf(d->date,"%s %d, %d",d->month,d->daynuminmonth,d->year);
    
    d->datekey = d->year*10000+d->monthnuminyear*100+ d->daynuminmonth; 

    d->daynuminyear=(int)localTime->tm_yday+1;
    d->weeknuminyear = d->daynuminyear/7 + 1;
    
    if(d->daynuminweek ==7){
	d->lastdayinweekfl[0]='1';
    }
    else{
	d->lastdayinweekfl[0]='0';
    }
    d->lastdayinweekfl[1]='\0';

    if(is_last_day_in_month(d->year,d->monthnuminyear,d->daynuminmonth)==1){
	d->lastdayinmonthfl[0]= '1';
    }else{
	d->lastdayinmonthfl[0]= '0';
    }
    d->lastdayinmonthfl[1]='\0';
 
    if(d->daynuminweek!=1 && d->daynuminweek!=7){
	d->weekdayfl[0]='1';
    }
    else{
	d->weekdayfl[0]='0';
    }
    
    d->weekdayfl[1]='\0';

    gen_season(d->sellingseason,d->monthnuminyear,d->daynuminmonth);
    d->slen = strlen(d->sellingseason);
    gen_holiday_fl(d->holidayfl,d->monthnuminyear,d->daynuminmonth);    
    return (0);
}